

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

bool __thiscall Network::Empty(Network *this)

{
  Network *pNVar1;
  
  std::mutex::lock(&this->_mutex);
  pNVar1 = (Network *)
           (this->_messages).super__List_base<MessageAddressed,_std::allocator<MessageAddressed>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return pNVar1 == this;
}

Assistant:

bool Network::Empty(){
    std::lock_guard<std::mutex> guard(_mutex);//互斥锁，保证多线程情况下只有一个在运行。
    return _messages.empty();
}